

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4ae0::CBSTest_ParseASN1Tag_Test::TestBody(CBSTest_ParseASN1Tag_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  anon_struct_32_3_59c873d7 *lhs;
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  size_type sVar4;
  char *pcVar5;
  char *in_R9;
  __0 *local_640;
  string local_500;
  AssertHelper local_4e0;
  Message local_4d8;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar__3;
  Message local_4b0;
  size_t local_4a8;
  uint local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_5;
  Message local_480;
  size_t local_478;
  uint local_46c;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_438;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_3f0;
  Message local_3e8;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_3a8;
  Message local_3a0;
  int local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_;
  Message local_378;
  size_t local_370;
  uint local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_3;
  Message local_348;
  size_t local_340;
  uint local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_2;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar;
  CBS child;
  CBS cbs;
  undefined1 auStack_2a8 [4];
  CBS_ASN1_TAG tag;
  Bytes local_298;
  ScopedTrace local_281;
  anon_struct_32_3_59c873d7 *paStack_280;
  ScopedTrace gtest_trace_305;
  anon_struct_32_3_59c873d7 *t;
  anon_struct_32_3_59c873d7 *__end1;
  anon_struct_32_3_59c873d7 *__begin1;
  anon_struct_32_3_59c873d7 (*__range1) [10];
  iterator local_258;
  size_type local_250;
  allocator<unsigned_char> local_245;
  uchar local_244 [4];
  iterator local_240;
  size_type local_238;
  allocator<unsigned_char> local_230;
  uchar local_22f [7];
  iterator local_228;
  size_type local_220;
  allocator<unsigned_char> local_218;
  uchar local_217 [7];
  iterator local_210;
  size_type local_208;
  allocator<unsigned_char> local_200;
  uchar local_1ff [7];
  iterator local_1f8;
  size_type local_1f0;
  allocator<unsigned_char> local_1e4;
  uchar local_1e3 [3];
  iterator local_1e0;
  size_type local_1d8;
  allocator<unsigned_char> local_1cc;
  uchar local_1cb [3];
  iterator local_1c8;
  size_type local_1c0;
  allocator<unsigned_char> local_1b3;
  uchar local_1b2 [2];
  iterator local_1b0;
  size_type local_1a8;
  allocator<unsigned_char> local_19b;
  uchar local_19a [2];
  iterator local_198;
  size_type local_190;
  allocator<unsigned_char> local_173;
  uchar local_172 [2];
  iterator local_170;
  size_type local_168;
  pointer *local_160;
  undefined1 local_158 [8];
  anon_struct_32_3_59c873d7 kTests [10];
  CBSTest_ParseASN1Tag_Test *this_local;
  
  __range1._2_1_ = 1;
  local_160 = (pointer *)local_158;
  local_158[0] = (__0)0x1;
  local_158._4_4_ = 0x20000010;
  local_172[0] = '0';
  local_172[1] = 0;
  local_170 = local_172;
  local_168 = 2;
  std::allocator<unsigned_char>::allocator(&local_173);
  __l_08._M_len = local_168;
  __l_08._M_array = local_170;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)kTests,__l_08,&local_173);
  local_160 = &kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  kTests[0].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xa0000004;
  local_19a[0] = 0xa4;
  local_19a[1] = 0;
  local_198 = local_19a;
  local_190 = 2;
  std::allocator<unsigned_char>::allocator(&local_19b);
  __l_07._M_len = local_190;
  __l_07._M_array = local_198;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 1),__l_07,&local_19b
            );
  local_160 = &kTests[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  kTests[1].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x4000001e;
  local_1b2[0] = '^';
  local_1b2[1] = 0;
  local_1b0 = local_1b2;
  local_1a8 = 2;
  std::allocator<unsigned_char>::allocator(&local_1b3);
  __l_06._M_len = local_1a8;
  __l_06._M_array = local_1b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 2),__l_06,&local_1b3
            );
  local_160 = &kTests[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  kTests[2].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x4000001f;
  local_1cb[0] = '_';
  local_1cb[1] = 0x1f;
  local_1cb[2] = 0;
  local_1c8 = local_1cb;
  local_1c0 = 3;
  std::allocator<unsigned_char>::allocator(&local_1cc);
  __l_05._M_len = local_1c0;
  __l_05._M_array = local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 3),__l_05,&local_1cc
            );
  local_160 = &kTests[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  kTests[3].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x40000020;
  local_1e3[0] = '_';
  local_1e3[1] = 0x20;
  local_1e3[2] = 0;
  local_1e0 = local_1e3;
  local_1d8 = 3;
  std::allocator<unsigned_char>::allocator(&local_1e4);
  __l_04._M_len = local_1d8;
  __l_04._M_array = local_1e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 4),__l_04,&local_1e4
            );
  local_160 = &kTests[4].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[4].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  kTests[4].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  local_1ff[0] = 0xff;
  local_1ff[1] = 0x81;
  local_1ff[2] = 0xff;
  local_1ff[3] = 0xff;
  local_1ff[4] = 0xff;
  local_1ff[5] = 0x7f;
  local_1ff[6] = 0;
  local_1f8 = local_1ff;
  local_1f0 = 7;
  std::allocator<unsigned_char>::allocator(&local_200);
  __l_03._M_len = local_1f0;
  __l_03._M_array = local_1f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 5),__l_03,&local_200
            );
  local_160 = &kTests[5].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[5].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  kTests[5].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_217[0] = 0xff;
  local_217[1] = 0x82;
  local_217[2] = 0xff;
  local_217[3] = 0xff;
  local_217[4] = 0xff;
  local_217[5] = 0x7f;
  local_217[6] = 0;
  local_210 = local_217;
  local_208 = 7;
  std::allocator<unsigned_char>::allocator(&local_218);
  __l_02._M_len = local_208;
  __l_02._M_array = local_210;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 6),__l_02,&local_218
            );
  local_160 = &kTests[6].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[6].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  kTests[6].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_22f[0] = 0xff;
  local_22f[1] = 0x90;
  local_22f[2] = 0x80;
  local_22f[3] = 0x80;
  local_22f[4] = 0x80;
  local_22f[5] = 0;
  local_22f[6] = 0;
  local_228 = local_22f;
  local_220 = 7;
  std::allocator<unsigned_char>::allocator(&local_230);
  __l_01._M_len = local_220;
  __l_01._M_array = local_228;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 7),__l_01,&local_230
            );
  local_160 = &kTests[7].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[7].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  kTests[7].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_244[0] = '_';
  local_244[1] = 0x80;
  local_244[2] = 0x1f;
  local_244[3] = 0;
  local_240 = local_244;
  local_238 = 4;
  std::allocator<unsigned_char>::allocator(&local_245);
  __l_00._M_len = local_238;
  __l_00._M_array = local_240;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 8),__l_00,&local_245
            );
  local_160 = &kTests[8].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  kTests[8].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  kTests[8].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  __range1._4_1_ = 0x5f;
  __range1._5_1_ = 0x80;
  __range1._6_1_ = 0x1e;
  __range1._7_1_ = 0;
  local_258 = (iterator)((long)&__range1 + 4);
  local_250 = 4;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 3));
  __l._M_len = local_250;
  __l._M_array = local_258;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 9),__l,
             (allocator<unsigned_char> *)((long)&__range1 + 3));
  __range1._2_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 3));
  std::allocator<unsigned_char>::~allocator(&local_245);
  std::allocator<unsigned_char>::~allocator(&local_230);
  std::allocator<unsigned_char>::~allocator(&local_218);
  std::allocator<unsigned_char>::~allocator(&local_200);
  std::allocator<unsigned_char>::~allocator(&local_1e4);
  std::allocator<unsigned_char>::~allocator(&local_1cc);
  std::allocator<unsigned_char>::~allocator(&local_1b3);
  std::allocator<unsigned_char>::~allocator(&local_19b);
  std::allocator<unsigned_char>::~allocator(&local_173);
  for (__end1 = (anon_struct_32_3_59c873d7 *)local_158;
      __end1 != (anon_struct_32_3_59c873d7 *)
                &kTests[9].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage; __end1 = __end1 + 1) {
    paStack_280 = __end1;
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)auStack_2a8,&__end1->in);
    Bytes::Bytes(&local_298,_auStack_2a8);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_281,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x131,&local_298);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_280->in);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_280->in);
    CBS_init((CBS *)&child.len,puVar3,sVar4);
    lhs = paStack_280;
    iVar2 = CBS_get_any_asn1((CBS *)&child.len,(CBS *)&gtest_ar.message_,
                             (CBS_ASN1_TAG *)((long)&cbs.len + 4));
    local_2e1 = iVar2 != 0;
    testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
              ((EqHelper *)local_2e0,"t.ok","!!CBS_get_any_asn1(&cbs, &child, &tag)",&lhs->ok,
               &local_2e1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x135,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message(&local_2f0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      if ((paStack_280->ok & 1U) != 0) {
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  ((EqHelper *)local_310,"t.tag","tag",&paStack_280->tag,
                   (uint *)((long)&cbs.len + 4));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
        if (!bVar1) {
          testing::Message::Message(&local_318);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x137,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_318);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_318);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
        local_334 = 0;
        local_340 = CBS_len((CBS *)&gtest_ar.message_);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_330,"0u","CBS_len(&child)",&local_334,&local_340);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
        if (!bVar1) {
          testing::Message::Message(&local_348);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x138,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_348);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_348);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
        local_364 = 0;
        local_370 = CBS_len((CBS *)&child.len);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_360,"0u","CBS_len(&cbs)",&local_364,&local_370);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
        if (!bVar1) {
          testing::Message::Message(&local_378);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x139,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_378)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
          testing::Message::~Message(&local_378);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_280->in);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_280->in);
        CBS_init((CBS *)&child.len,puVar3,sVar4);
        local_394 = CBS_peek_asn1_tag((CBS *)&child.len,paStack_280->tag);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_390,&local_394,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
        if (!bVar1) {
          testing::Message::Message(&local_3a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1.message_,(internal *)local_390,
                     (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag)","false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_3a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x13c,pcVar5);
          testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
          testing::internal::AssertHelper::~AssertHelper(&local_3a8);
          std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_3a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
        iVar2 = CBS_peek_asn1_tag((CBS *)&child.len,paStack_280->tag + 1);
        local_3d9 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
        if (!bVar1) {
          testing::Message::Message(&local_3e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_3d8,
                     (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag + 1)","true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_3f0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x13d,pcVar5);
          testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
          testing::internal::AssertHelper::~AssertHelper(&local_3f0);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_3e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
        local_424 = CBS_get_asn1((CBS *)&child.len,(CBS *)&gtest_ar.message_,paStack_280->tag);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_420,&local_424,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
        if (!bVar1) {
          testing::Message::Message(&local_430);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_420,
                     (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag)","false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_438,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x13f,pcVar5);
          testing::internal::AssertHelper::operator=(&local_438,&local_430);
          testing::internal::AssertHelper::~AssertHelper(&local_438);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_430);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
        local_46c = 0;
        local_478 = CBS_len((CBS *)&gtest_ar.message_);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_468,"0u","CBS_len(&child)",&local_46c,&local_478);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
        if (!bVar1) {
          testing::Message::Message(&local_480);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x140,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_480);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_480);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
        local_49c = 0;
        local_4a8 = CBS_len((CBS *)&child.len);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_498,"0u","CBS_len(&cbs)",&local_49c,&local_4a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
        if (!bVar1) {
          testing::Message::Message(&local_4b0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x141,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_4b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_4b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
        puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_280->in);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_280->in);
        CBS_init((CBS *)&child.len,puVar3,sVar4);
        iVar2 = CBS_get_asn1((CBS *)&child.len,(CBS *)&gtest_ar.message_,paStack_280->tag + 1);
        local_4c9 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
        if (!bVar1) {
          testing::Message::Message(&local_4d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_500,(internal *)local_4c8,
                     (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag + 1)","true","false",in_R9
                    );
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_4e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x144,pcVar5);
          testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
          testing::internal::AssertHelper::~AssertHelper(&local_4e0);
          std::__cxx11::string::~string((string *)&local_500);
          testing::Message::~Message(&local_4d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    testing::ScopedTrace::~ScopedTrace(&local_281);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_00284049;
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_00284049:
  local_640 = (__0 *)&kTests[9].in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_640 = local_640 + -0x20;
    (anonymous_namespace)::CBSTest_ParseASN1Tag_Test::TestBody()::$_0::~__0(local_640);
  } while (local_640 != (__0 *)local_158);
  return;
}

Assistant:

TEST(CBSTest, ParseASN1Tag) {
  const struct {
    bool ok;
    CBS_ASN1_TAG tag;
    std::vector<uint8_t> in;
  } kTests[] = {
      {true, CBS_ASN1_SEQUENCE, {0x30, 0}},
      {true, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4, {0xa4, 0}},
      {true, CBS_ASN1_APPLICATION | 30, {0x5e, 0}},
      {true, CBS_ASN1_APPLICATION | 31, {0x5f, 0x1f, 0}},
      {true, CBS_ASN1_APPLICATION | 32, {0x5f, 0x20, 0}},
      {true,
       CBS_ASN1_PRIVATE | CBS_ASN1_CONSTRUCTED | 0x1fffffff,
       {0xff, 0x81, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number fits in |uint32_t| but not |CBS_ASN1_TAG_NUMBER_MASK|.
      {false, 0, {0xff, 0x82, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number does not fit in |uint32_t|.
      {false, 0, {0xff, 0x90, 0x80, 0x80, 0x80, 0, 0}},
      // Tag number is not minimally-encoded
      {false, 0, {0x5f, 0x80, 0x1f, 0}},
      // Tag number should have used short form.
      {false, 0, {0x5f, 0x80, 0x1e, 0}},
  };
  for (const auto &t : kTests) {
    SCOPED_TRACE(Bytes(t.in));
    CBS_ASN1_TAG tag;
    CBS cbs, child;
    CBS_init(&cbs, t.in.data(), t.in.size());
    ASSERT_EQ(t.ok, !!CBS_get_any_asn1(&cbs, &child, &tag));
    if (t.ok) {
      EXPECT_EQ(t.tag, tag);
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_TRUE(CBS_peek_asn1_tag(&cbs, t.tag));
      EXPECT_FALSE(CBS_peek_asn1_tag(&cbs, t.tag + 1));

      EXPECT_TRUE(CBS_get_asn1(&cbs, &child, t.tag));
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_FALSE(CBS_get_asn1(&cbs, &child, t.tag + 1));
    }
  }
}